

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  int *piVar1;
  int iVar2;
  Nwk_Obj_t *pNVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  char *__assertion;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  for (lVar5 = 0;
      (uVar4 = (ulong)pNode->nFanins, lVar5 < (long)uVar4 &&
      (pNVar3 = pNode->pFanio[lVar5], pNVar3 != (Nwk_Obj_t *)0x0)); lVar5 = lVar5 + 1) {
    pPinPerm[lVar5] = (int)lVar5;
    pPinDelays[lVar5] = pNVar3->tArrival;
  }
  lVar5 = 1;
  uVar7 = 0;
  while( true ) {
    iVar2 = (int)uVar4;
    if ((long)(iVar2 + -1) <= (long)uVar7) break;
    uVar10 = uVar7 & 0xffffffff;
    lVar8 = lVar5;
    while( true ) {
      uVar9 = (uint)uVar10;
      if (iVar2 <= lVar8) break;
      uVar6 = (uint)lVar8;
      if (pPinDelays[pPinPerm[lVar8]] < pPinDelays[pPinPerm[(int)uVar9]] ||
          pPinDelays[pPinPerm[lVar8]] == pPinDelays[pPinPerm[(int)uVar9]]) {
        uVar6 = uVar9;
      }
      lVar8 = lVar8 + 1;
      uVar10 = (ulong)uVar6;
    }
    if (uVar7 != uVar10) {
      iVar2 = pPinPerm[uVar7];
      pPinPerm[uVar7] = pPinPerm[(int)uVar9];
      pPinPerm[(int)uVar9] = iVar2;
      uVar4 = (ulong)(uint)pNode->nFanins;
    }
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 1;
  }
  if ((iVar2 == 0) || (*pPinPerm < iVar2)) {
    lVar5 = 1;
    do {
      if (iVar2 <= lVar5) {
        return;
      }
      piVar1 = pPinPerm + lVar5;
      if (iVar2 <= *piVar1) {
        __assertion = "pPinPerm[i] < Nwk_ObjFaninNum(pNode)";
        uVar9 = 0x5f;
        goto LAB_0070aa6b;
      }
      lVar8 = lVar5 + -1;
      lVar5 = lVar5 + 1;
    } while (pPinDelays[*piVar1] <= pPinDelays[pPinPerm[lVar8]]);
    __assertion = "pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]";
    uVar9 = 0x60;
  }
  else {
    __assertion = "Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode)";
    uVar9 = 0x5c;
  }
LAB_0070aa6b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                ,uVar9,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
}

Assistant:

void Nwk_ManDelayTraceSortPins( Nwk_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Nwk_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Nwk_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Nwk_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Nwk_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode) );
    for ( i = 1; i < Nwk_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Nwk_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}